

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_traits.h
# Opt level: O3

MessageType __thiscall
google::protobuf::json_internal::ClassifyMessage(json_internal *this,string_view name)

{
  char *pcVar1;
  int iVar2;
  size_type __rlen;
  json_internal *__n;
  MessageType MVar3;
  char *pcVar4;
  undefined1 auVar5 [16];
  
  pcVar4 = (char *)name._M_len;
  MVar3 = kNotWellKnown;
  if (this < (json_internal *)0x10) {
    return kNotWellKnown;
  }
  auVar5[0] = -(*pcVar4 == 'g');
  auVar5[1] = -(pcVar4[1] == 'o');
  auVar5[2] = -(pcVar4[2] == 'o');
  auVar5[3] = -(pcVar4[3] == 'g');
  auVar5[4] = -(pcVar4[4] == 'l');
  auVar5[5] = -(pcVar4[5] == 'e');
  auVar5[6] = -(pcVar4[6] == '.');
  auVar5[7] = -(pcVar4[7] == 'p');
  auVar5[8] = -(pcVar4[8] == 'r');
  auVar5[9] = -(pcVar4[9] == 'o');
  auVar5[10] = -(pcVar4[10] == 't');
  auVar5[0xb] = -(pcVar4[0xb] == 'o');
  auVar5[0xc] = -(pcVar4[0xc] == 'b');
  auVar5[0xd] = -(pcVar4[0xd] == 'u');
  auVar5[0xe] = -(pcVar4[0xe] == 'f');
  auVar5[0xf] = -(pcVar4[0xf] == '.');
  if ((ushort)((ushort)(SUB161(auVar5 >> 7,0) & 1) | (ushort)(SUB161(auVar5 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar5 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar5 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar5 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar5 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar5 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar5 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar5 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar5 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar5 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar5 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar5 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar5 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar5 >> 0x77,0) & 1) << 0xe | (ushort)(auVar5[0xf] >> 7) << 0xf) !=
      0xffff) {
    return kNotWellKnown;
  }
  if ((json_internal *)0x8 < this + -0x13) {
    return kNotWellKnown;
  }
  __n = this + -0x10;
  pcVar4 = pcVar4 + 0x10;
  switch(this) {
  case (json_internal *)0x13:
    iVar2 = bcmp(pcVar4,"Any",(size_t)__n);
    MVar3 = (MessageType)(iVar2 == 0);
    break;
  case (json_internal *)0x15:
    iVar2 = bcmp(pcVar4,"Value",(size_t)__n);
    MVar3 = (uint)(iVar2 == 0) * 5;
    break;
  case (json_internal *)0x16:
    iVar2 = bcmp(pcVar4,"Struct",(size_t)__n);
    MVar3 = (uint)(iVar2 == 0) * 3;
    break;
  case (json_internal *)0x18:
    iVar2 = bcmp(pcVar4,"Duration",(size_t)__n);
    MVar3 = (uint)(iVar2 == 0) << 3;
    break;
  case (json_internal *)0x19:
    iVar2 = bcmp(pcVar4,"BoolValue",(size_t)__n);
    if (iVar2 == 0) {
      MVar3 = kWrapper;
    }
    else {
      iVar2 = bcmp(pcVar4,"NullValue",(size_t)__n);
      if (iVar2 == 0) {
        MVar3 = kNull;
      }
      else {
        iVar2 = bcmp(pcVar4,"ListValue",(size_t)__n);
        if (iVar2 == 0) {
          MVar3 = kList;
        }
        else {
          iVar2 = bcmp(pcVar4,"Timestamp",(size_t)__n);
          if (iVar2 == 0) {
            MVar3 = kTimestamp;
          }
          else {
            iVar2 = bcmp(pcVar4,"FieldMask",(size_t)__n);
            MVar3 = (uint)(iVar2 == 0) * 9;
          }
        }
      }
    }
    break;
  case (json_internal *)0x1a:
    iVar2 = bcmp(pcVar4,"BytesValue",(size_t)__n);
    if (iVar2 == 0) {
      return kWrapper;
    }
    iVar2 = bcmp(pcVar4,"FloatValue",(size_t)__n);
    if (iVar2 == 0) {
      return kWrapper;
    }
    iVar2 = bcmp(pcVar4,"Int32Value",(size_t)__n);
    if (iVar2 == 0) {
      return kWrapper;
    }
    pcVar1 = "google.protobuf.Int64Value";
    goto LAB_002c7173;
  case (json_internal *)0x1b:
    iVar2 = bcmp(pcVar4,"DoubleValue",(size_t)__n);
    if (iVar2 == 0) {
      return kWrapper;
    }
    iVar2 = bcmp(pcVar4,"StringValue",(size_t)__n);
    if (iVar2 == 0) {
      return kWrapper;
    }
    iVar2 = bcmp(pcVar4,"UInt32Value",(size_t)__n);
    if (iVar2 == 0) {
      return kWrapper;
    }
    pcVar1 = "google.protobuf.UInt64Value";
LAB_002c7173:
    iVar2 = bcmp(pcVar4,pcVar1 + 0x10,(size_t)__n);
    MVar3 = (uint)(iVar2 == 0) * 2;
  }
  return MVar3;
}

Assistant:

inline MessageType ClassifyMessage(absl::string_view name) {
  constexpr absl::string_view kWellKnownPkg = "google.protobuf.";
  if (!absl::StartsWith(name, kWellKnownPkg)) {
    return MessageType::kNotWellKnown;
  }
  name = name.substr(kWellKnownPkg.size());

  switch (name.size()) {
    case 3:
      if (name == "Any") {
        return MessageType::kAny;
      }
      break;
    case 5:
      if (name == "Value") {
        return MessageType::kValue;
      }
      break;
    case 6:
      if (name == "Struct") {
        return MessageType::kStruct;
      }
      break;
    case 8:
      if (name == "Duration") {
        return MessageType::kDuration;
      }
      break;
    case 9:
      if (name == "BoolValue") {
        return MessageType::kWrapper;
      }
      if (name == "NullValue") {
        return MessageType::kNull;
      }
      if (name == "ListValue") {
        return MessageType::kList;
      }
      if (name == "Timestamp") {
        return MessageType::kTimestamp;
      }
      if (name == "FieldMask") {
        return MessageType::kFieldMask;
      }
      break;
    case 10:
      if (name == "BytesValue" || name == "FloatValue" ||
          name == "Int32Value" || name == "Int64Value") {
        return MessageType::kWrapper;
      }
      break;
    case 11:
      if (name == "DoubleValue" || name == "StringValue" ||
          name == "UInt32Value" || name == "UInt64Value") {
        return MessageType::kWrapper;
      }
      break;
    default:
      break;
  }

  return MessageType::kNotWellKnown;
}